

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

GLuint __thiscall gl4cts::EnhancedLayouts::Utils::Type::GetLocations(Type *this)

{
  return this->m_n_columns << (this->m_basic_type == Double && 2 < this->m_n_rows);
}

Assistant:

GLuint Type::GetLocations() const
{
	GLuint n_loc_per_column;

	/* 1 or 2 doubles any for rest */
	if ((2 >= m_n_rows) || (Double != m_basic_type))
	{
		n_loc_per_column = 1;
	}
	else
	{
		/* 3 and 4 doubles */
		n_loc_per_column = 2;
	}

	return n_loc_per_column * m_n_columns;
}